

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O1

QRect __thiscall
QStyle::itemTextRect
          (QStyle *this,QFontMetrics *metrics,QRect *rect,int alignment,bool enabled,QString *text)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  QStyle *this_00;
  QStyle *pQVar6;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  QRect QVar10;
  uint local_48;
  uint local_44;
  int local_40;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (rect->x1).m_i;
  auVar4._4_4_ = 0;
  auVar4._0_4_ = uVar1;
  uVar2 = (rect->y1).m_i;
  uVar8 = (ulong)uVar2;
  iVar5 = (rect->x2).m_i;
  auVar4._8_4_ = iVar5;
  auVar4._12_4_ = 0;
  uVar3 = (rect->y2).m_i;
  uVar7 = (ulong)uVar3;
  if ((text->d).size != 0) {
    local_48 = uVar1;
    local_44 = uVar2;
    local_40 = iVar5;
    local_3c = uVar3;
    auVar9 = QFontMetrics::boundingRect
                       ((QRect *)metrics,(int)&local_48,(QString *)(ulong)(uint)alignment,(int)text,
                        (int *)0x0);
    this_00 = auVar9._0_8_;
    uVar8 = (ulong)this_00 >> 0x20;
    uVar7 = auVar9._8_8_ >> 0x20;
    auVar4 = auVar9;
    if (!enabled) {
      pQVar6 = proxy(this_00);
      iVar5 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0,0,0,0);
      if (iVar5 != 0) {
        auVar4._8_4_ = auVar9._8_4_ + 1;
        auVar4._0_8_ = (ulong)this_00;
        auVar4._12_4_ = 0;
        uVar7 = (ulong)(auVar9._12_4_ + 1);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar10._0_8_ = auVar4._0_8_ & 0xffffffff | uVar8 << 0x20;
    QVar10._8_8_ = auVar4._8_8_ & 0xffffffff | uVar7 << 0x20;
    return QVar10;
  }
  __stack_chk_fail();
}

Assistant:

QRect QStyle::itemTextRect(const QFontMetrics &metrics, const QRect &rect, int alignment, bool enabled,
                       const QString &text) const
{
    QRect result;
    int x, y, w, h;
    rect.getRect(&x, &y, &w, &h);
    if (!text.isEmpty()) {
        result = metrics.boundingRect(x, y, w, h, alignment, text);
        if (!enabled && proxy()->styleHint(SH_EtchDisabledText)) {
            result.setWidth(result.width()+1);
            result.setHeight(result.height()+1);
        }
    } else {
        result = QRect(x, y, w, h);
    }
    return result;
}